

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_port.hpp
# Opt level: O0

iu_uint_max_t iutest::internal::posix::FileSizeBySeekSet(FILE *fp)

{
  int iVar1;
  iu_off_t pos;
  iu_uint_max_t iVar2;
  iu_off_t size;
  iu_off_t pre;
  FILE *fp_local;
  
  if (((fp != (FILE *)0x0) && (pos = FileTell(fp), pos != -1)) &&
     (iVar1 = FileSeek(fp,0,2), iVar1 == 0)) {
    iVar2 = FileTell(fp);
    FileSeek(fp,pos,0);
    return iVar2;
  }
  return 0;
}

Assistant:

inline iu_uint_max_t FileSizeBySeekSet(FILE* fp)
{
    if( fp == NULL )
    {
        return 0;
    }
    const iu_off_t pre = FileTell(fp);
    if( (pre != -1) && (FileSeek(fp, 0, SEEK_END) == 0) )
    {
        const iu_off_t size = FileTell(fp);
        IUTEST_UNUSED_RETURN(FileSeek(fp, pre, SEEK_SET));
        return static_cast<iu_uint_max_t>(size);
    }
    return 0;
}